

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dump_nodes(nodes_list_t *n)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (n->super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)n;
      p_Var1 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*(int *)&p_Var1[1]._M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)&p_Var1[1]._M_next + 4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return;
}

Assistant:

void dump_nodes(const nodes_list_t& n)
{
    nodes_list_t::const_iterator i = n.begin();
    while (i != n.end())
    {
        std::cerr << "(" << i->first << ", " << i->second << ") ";
        i++;
    }
    std::cerr << std::endl;
}